

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageReceiver.cpp
# Opt level: O3

bool __thiscall
unixsocketipc::MessageReceiver::receive_message
          (MessageReceiver *this,int client_socket_fd,uint32_t *id,char *buf,uint32_t *size)

{
  ssize_t sVar1;
  uint32_t *__buf;
  uint32_t num_bytes_left;
  uint uVar2;
  size_t sVar3;
  uint32_t num_bytes_left_2;
  uint32_t uVar4;
  bool bVar5;
  
  sVar3 = 4;
  do {
    sVar1 = recv(client_socket_fd,id,sVar3,0);
    uVar2 = (uint)sVar1;
    if ((int)uVar2 < 1) {
      return false;
    }
    id = (uint32_t *)((long)id + (ulong)(uVar2 & 0x7fffffff));
    uVar2 = (int)sVar3 - uVar2;
    sVar3 = (size_t)uVar2;
  } while (uVar2 != 0);
  sVar3 = 4;
  __buf = size;
  do {
    sVar1 = recv(client_socket_fd,__buf,sVar3,0);
    uVar2 = (uint)sVar1;
    if ((int)uVar2 < 1) {
      return false;
    }
    __buf = (uint32_t *)((long)__buf + (ulong)(uVar2 & 0x7fffffff));
    uVar2 = (int)sVar3 - uVar2;
    sVar3 = (size_t)uVar2;
  } while (uVar2 != 0);
  uVar4 = *size;
  if (uVar4 == 0) {
    bVar5 = true;
  }
  else {
    do {
      sVar1 = recv(client_socket_fd,buf,(ulong)uVar4,0);
      uVar2 = (uint)sVar1;
      bVar5 = 0 < (int)uVar2;
      if ((int)uVar2 < 1) {
        return bVar5;
      }
      buf = buf + (uVar2 & 0x7fffffff);
      uVar4 = uVar4 - uVar2;
    } while (uVar4 != 0);
  }
  return bVar5;
}

Assistant:

bool MessageReceiver::receive_message(int client_socket_fd, uint32_t &id, char* buf, uint32_t &size ) {
   if (!receive_buffer(client_socket_fd, reinterpret_cast<char*>(&id), sizeof(id)))
      return false;

   if (!receive_buffer(client_socket_fd, reinterpret_cast<char*>(&size), sizeof(size)))
      return false;

   assert(size <= MESSAGE_BUFF_SIZE && "Received message size exceeds reception buffer size!");

   if (!receive_buffer(client_socket_fd, buf, size))
      return false;

   return true;
}